

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O1

OPJ_BOOL opj_jp2_read_jp(opj_jp2_t *jp2,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                        opj_event_mgr_t *p_manager)

{
  undefined8 in_RAX;
  char *fmt;
  OPJ_UINT32 l_magic_number;
  OPJ_UINT32 local_24;
  
  local_24 = (OPJ_UINT32)((ulong)in_RAX >> 0x20);
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x9f7,
                  "OPJ_BOOL opj_jp2_read_jp(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (jp2 != (opj_jp2_t *)0x0) {
    if (p_manager == (opj_event_mgr_t *)0x0) {
      __assert_fail("p_manager != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                    ,0x9f9,
                    "OPJ_BOOL opj_jp2_read_jp(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                   );
    }
    if (jp2->jp2_state == 0) {
      if (p_header_size == 4) {
        opj_read_bytes_LE(p_header_data,&local_24,4);
        if (local_24 == 0xd0a870a) {
          *(byte *)&jp2->jp2_state = (byte)jp2->jp2_state | 1;
          return 1;
        }
        fmt = "Error with JP Signature : bad magic number\n";
      }
      else {
        fmt = "Error with JP signature Box size\n";
      }
    }
    else {
      fmt = "The signature box must be the first box in the file.\n";
    }
    opj_event_msg(p_manager,1,fmt);
    return 0;
  }
  __assert_fail("jp2 != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                ,0x9f8,
                "OPJ_BOOL opj_jp2_read_jp(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)");
}

Assistant:

static OPJ_BOOL opj_jp2_read_jp(opj_jp2_t *jp2,
                                OPJ_BYTE * p_header_data,
                                OPJ_UINT32 p_header_size,
                                opj_event_mgr_t * p_manager
                               )

{
    OPJ_UINT32 l_magic_number;

    /* preconditions */
    assert(p_header_data != 00);
    assert(jp2 != 00);
    assert(p_manager != 00);

    if (jp2->jp2_state != JP2_STATE_NONE) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "The signature box must be the first box in the file.\n");
        return OPJ_FALSE;
    }

    /* assure length of data is correct (4 -> magic number) */
    if (p_header_size != 4) {
        opj_event_msg(p_manager, EVT_ERROR, "Error with JP signature Box size\n");
        return OPJ_FALSE;
    }

    /* rearrange data */
    opj_read_bytes(p_header_data, &l_magic_number, 4);
    if (l_magic_number != 0x0d0a870a) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Error with JP Signature : bad magic number\n");
        return OPJ_FALSE;
    }

    jp2->jp2_state |= JP2_STATE_SIGNATURE;

    return OPJ_TRUE;
}